

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseUtils.h
# Opt level: O2

bool Glucose::match<char_const*>(char **in,char *str)

{
  char cVar1;
  char cVar2;
  char *pcVar3;
  
  pcVar3 = *in;
  do {
    cVar1 = *str;
    if (cVar1 == '\0') {
      *in = pcVar3;
      break;
    }
    str = str + 1;
    cVar2 = *pcVar3;
    pcVar3 = pcVar3 + 1;
  } while (cVar2 == cVar1);
  return cVar1 == '\0';
}

Assistant:

static bool match(B& in, const char* str) {
    int i;
    for (i = 0; str[i] != '\0'; i++)
        if (in[i] != str[i])
            return false;

    in += i;

    return true; 
}